

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  Scene *pSVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  int iVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong unaff_R12;
  size_t mask;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  vint4 bi;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai;
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar51;
  uint uVar54;
  uint uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong local_b80;
  RTCFilterFunctionNArguments local_a90;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar68 = ZEXT1664(CONCAT412(fVar41,CONCAT48(fVar41,CONCAT44(fVar41,fVar41))));
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar36._4_4_ = fVar44;
  auVar36._0_4_ = fVar44;
  auVar36._8_4_ = fVar44;
  auVar36._12_4_ = fVar44;
  fVar41 = fVar41 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar38._4_4_ = fVar45;
  auVar38._0_4_ = fVar45;
  auVar38._8_4_ = fVar45;
  auVar38._12_4_ = fVar45;
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar47._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  auVar47._8_4_ = -fVar41;
  auVar47._12_4_ = -fVar41;
  auVar48._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  auVar48._8_4_ = -fVar44;
  auVar48._12_4_ = -fVar44;
  local_a10 = 0x80000000;
  uStack_a0c = 0x80000000;
  uStack_a08 = 0x80000000;
  uStack_a04 = 0x80000000;
  auVar42._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  auVar42._8_4_ = -fVar45;
  auVar42._12_4_ = -fVar45;
  iVar17 = (tray->tnear).field_0.i[k];
  auVar49._4_4_ = iVar17;
  auVar49._0_4_ = iVar17;
  auVar49._8_4_ = iVar17;
  auVar49._12_4_ = iVar17;
  iVar17 = (tray->tfar).field_0.i[k];
  auVar52._4_4_ = iVar17;
  auVar52._0_4_ = iVar17;
  auVar52._8_4_ = iVar17;
  auVar52._12_4_ = iVar17;
  iVar17 = 1 << ((uint)k & 0x1f);
  auVar32._4_4_ = iVar17;
  auVar32._0_4_ = iVar17;
  auVar32._8_4_ = iVar17;
  auVar32._12_4_ = iVar17;
  auVar32._16_4_ = iVar17;
  auVar32._20_4_ = iVar17;
  auVar32._24_4_ = iVar17;
  auVar32._28_4_ = iVar17;
  auVar5 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar32 = vpand_avx2(auVar32,auVar5);
  local_940 = vpcmpeqd_avx2(auVar32,auVar5);
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  puVar24 = local_7f8;
  do {
    puVar23 = puVar24;
    if (puVar23 == &local_800) break;
    puVar24 = puVar23 + -1;
    uVar28 = puVar23[-1];
    do {
      if ((uVar28 & 8) == 0) {
        auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar21),auVar47,
                                 auVar68._0_16_);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar25),auVar48,auVar36);
        auVar7 = vpmaxsd_avx(auVar7,auVar43);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar26),auVar42,auVar38);
        auVar43 = vpmaxsd_avx(auVar43,auVar49);
        auVar7 = vpmaxsd_avx(auVar7,auVar43);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar21 ^ 0x10)),auVar47,
                                  auVar68._0_16_);
        auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar25 ^ 0x10)),auVar48,
                                  auVar36);
        auVar43 = vpminsd_avx(auVar43,auVar62);
        auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar26 ^ 0x10)),auVar42,
                                  auVar38);
        auVar62 = vpminsd_avx(auVar62,auVar52);
        auVar43 = vpminsd_avx(auVar43,auVar62);
        auVar7 = vpcmpgtd_avx(auVar7,auVar43);
        uVar18 = vmovmskps_avx(auVar7);
        unaff_R12 = (ulong)(byte)((byte)uVar18 ^ 0xf);
      }
      if ((uVar28 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar51 = 4;
        }
        else {
          uVar27 = uVar28 & 0xfffffffffffffff0;
          lVar22 = 0;
          for (uVar28 = unaff_R12; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          for (uVar19 = unaff_R12 - 1 & unaff_R12; uVar28 = *(ulong *)(uVar27 + lVar22 * 8),
              uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
            *puVar24 = uVar28;
            puVar24 = puVar24 + 1;
            lVar22 = 0;
            for (uVar28 = uVar19; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
          }
          uVar51 = 0;
        }
      }
      else {
        uVar51 = 6;
      }
    } while (uVar51 == 0);
    if (uVar51 == 6) {
      uVar27 = (ulong)((uint)uVar28 & 0xf);
      uVar51 = 0;
      uVar19 = uVar27 - 8;
      bVar29 = uVar27 != 8;
      if (bVar29) {
        uVar28 = uVar28 & 0xfffffffffffffff0;
        uVar27 = 0;
        do {
          lVar22 = uVar27 * 0xb0;
          auVar7 = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar22);
          auVar43 = *(undefined1 (*) [16])(uVar28 + 0x40 + lVar22);
          auVar62 = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar22);
          auVar53 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar22);
          auVar31._0_4_ = auVar7._0_4_ * auVar43._0_4_;
          auVar31._4_4_ = auVar7._4_4_ * auVar43._4_4_;
          auVar31._8_4_ = auVar7._8_4_ * auVar43._8_4_;
          auVar31._12_4_ = auVar7._12_4_ * auVar43._12_4_;
          local_970 = vfmsub231ps_fma(auVar31,auVar62,auVar53);
          auVar31 = *(undefined1 (*) [16])(uVar28 + 0x60 + lVar22);
          auVar37 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar22);
          auVar33._0_4_ = auVar53._0_4_ * auVar31._0_4_;
          auVar33._4_4_ = auVar53._4_4_ * auVar31._4_4_;
          auVar33._8_4_ = auVar53._8_4_ * auVar31._8_4_;
          auVar33._12_4_ = auVar53._12_4_ * auVar31._12_4_;
          local_960 = vfmsub231ps_fma(auVar33,auVar7,auVar37);
          uVar18 = *(undefined4 *)(ray + k * 4);
          auVar58._4_4_ = uVar18;
          auVar58._0_4_ = uVar18;
          auVar58._8_4_ = uVar18;
          auVar58._12_4_ = uVar18;
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + lVar22),auVar58);
          uVar18 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar59._4_4_ = uVar18;
          auVar59._0_4_ = uVar18;
          auVar59._8_4_ = uVar18;
          auVar59._12_4_ = uVar18;
          auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x10 + lVar22),auVar59);
          uVar18 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar60._4_4_ = uVar18;
          auVar60._0_4_ = uVar18;
          auVar60._8_4_ = uVar18;
          auVar60._12_4_ = uVar18;
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + lVar22),auVar60);
          fVar41 = *(float *)(ray + k * 4 + 0x80);
          auVar61._4_4_ = fVar41;
          auVar61._0_4_ = fVar41;
          auVar61._8_4_ = fVar41;
          auVar61._12_4_ = fVar41;
          fVar44 = *(float *)(ray + k * 4 + 0xa0);
          auVar63._4_4_ = fVar44;
          auVar63._0_4_ = fVar44;
          auVar63._8_4_ = fVar44;
          auVar63._12_4_ = fVar44;
          fVar45 = *(float *)(ray + k * 4 + 0xc0);
          auVar64._4_4_ = fVar45;
          auVar64._0_4_ = fVar45;
          auVar64._8_4_ = fVar45;
          auVar64._12_4_ = fVar45;
          auVar66._0_4_ = fVar41 * auVar58._0_4_;
          auVar66._4_4_ = fVar41 * auVar58._4_4_;
          auVar66._8_4_ = fVar41 * auVar58._8_4_;
          auVar66._12_4_ = fVar41 * auVar58._12_4_;
          auVar50 = vfmsub231ps_fma(auVar66,auVar33,auVar63);
          auVar57._0_4_ = auVar7._0_4_ * auVar50._0_4_;
          auVar57._4_4_ = auVar7._4_4_ * auVar50._4_4_;
          auVar57._8_4_ = auVar7._8_4_ * auVar50._8_4_;
          auVar57._12_4_ = auVar7._12_4_ * auVar50._12_4_;
          auVar67._0_4_ = auVar53._0_4_ * auVar50._0_4_;
          auVar67._4_4_ = auVar53._4_4_ * auVar50._4_4_;
          auVar67._8_4_ = auVar53._8_4_ * auVar50._8_4_;
          auVar67._12_4_ = auVar53._12_4_ * auVar50._12_4_;
          auVar53._0_4_ = fVar45 * auVar33._0_4_;
          auVar53._4_4_ = fVar45 * auVar33._4_4_;
          auVar53._8_4_ = fVar45 * auVar33._8_4_;
          auVar53._12_4_ = fVar45 * auVar33._12_4_;
          auVar53 = vfmsub231ps_fma(auVar53,auVar59,auVar61);
          auVar7 = vfmadd231ps_fma(auVar57,auVar53,auVar62);
          auVar53 = vfmadd231ps_fma(auVar67,auVar43,auVar53);
          auVar50._0_4_ = auVar62._0_4_ * auVar37._0_4_;
          auVar50._4_4_ = auVar62._4_4_ * auVar37._4_4_;
          auVar50._8_4_ = auVar62._8_4_ * auVar37._8_4_;
          auVar50._12_4_ = auVar62._12_4_ * auVar37._12_4_;
          local_950 = vfmsub231ps_fma(auVar50,auVar31,auVar43);
          auVar43._0_4_ = fVar44 * auVar59._0_4_;
          auVar43._4_4_ = fVar44 * auVar59._4_4_;
          auVar43._8_4_ = fVar44 * auVar59._8_4_;
          auVar43._12_4_ = fVar44 * auVar59._12_4_;
          auVar50 = vfmsub231ps_fma(auVar43,auVar58,auVar64);
          auVar65._0_4_ = local_950._0_4_ * fVar45;
          auVar65._4_4_ = local_950._4_4_ * fVar45;
          auVar65._8_4_ = local_950._8_4_ * fVar45;
          auVar65._12_4_ = local_950._12_4_ * fVar45;
          auVar43 = vfmadd231ps_fma(auVar65,local_960,auVar63);
          auVar62 = vfmadd231ps_fma(auVar43,local_970,auVar61);
          auVar43 = vfmadd231ps_fma(auVar7,auVar50,auVar31);
          auVar7._4_4_ = uStack_a0c;
          auVar7._0_4_ = local_a10;
          auVar7._8_4_ = uStack_a08;
          auVar7._12_4_ = uStack_a04;
          auVar7 = vandps_avx(auVar62,auVar7);
          uVar51 = auVar7._0_4_;
          local_a00._0_4_ = (float)(uVar51 ^ auVar43._0_4_);
          uVar54 = auVar7._4_4_;
          local_a00._4_4_ = (float)(uVar54 ^ auVar43._4_4_);
          uVar55 = auVar7._8_4_;
          local_a00._8_4_ = (float)(uVar55 ^ auVar43._8_4_);
          uVar56 = auVar7._12_4_;
          local_a00._12_4_ = (float)(uVar56 ^ auVar43._12_4_);
          auVar7 = vfmadd231ps_fma(auVar53,auVar37,auVar50);
          local_9f0._0_4_ = (float)(uVar51 ^ auVar7._0_4_);
          local_9f0._4_4_ = (float)(uVar54 ^ auVar7._4_4_);
          local_9f0._8_4_ = (float)(uVar55 ^ auVar7._8_4_);
          local_9f0._12_4_ = (float)(uVar56 ^ auVar7._12_4_);
          auVar53 = ZEXT416(0) << 0x20;
          auVar7 = vcmpps_avx(local_a00,auVar53,5);
          auVar43 = vcmpps_avx(local_9f0,auVar53,5);
          auVar7 = vandps_avx(auVar43,auVar7);
          local_9d0 = vandps_avx(auVar62,local_a20);
          auVar43 = vcmpps_avx(auVar62,auVar53,4);
          auVar7 = vandps_avx(auVar7,auVar43);
          auVar62._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
          auVar62._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
          auVar62._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
          auVar62._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
          auVar43 = vcmpps_avx(auVar62,local_9d0,2);
          auVar62 = auVar43 & auVar7;
          if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar62[0xf] < '\0') {
            auVar7 = vandps_avx(auVar7,auVar43);
            auVar39._0_4_ = local_950._0_4_ * auVar59._0_4_;
            auVar39._4_4_ = local_950._4_4_ * auVar59._4_4_;
            auVar39._8_4_ = local_950._8_4_ * auVar59._8_4_;
            auVar39._12_4_ = local_950._12_4_ * auVar59._12_4_;
            auVar43 = vfmadd213ps_fma(auVar58,local_960,auVar39);
            auVar43 = vfmadd213ps_fma(auVar33,local_970,auVar43);
            local_9e0._0_4_ = (float)(uVar51 ^ auVar43._0_4_);
            local_9e0._4_4_ = (float)(uVar54 ^ auVar43._4_4_);
            local_9e0._8_4_ = (float)(uVar55 ^ auVar43._8_4_);
            local_9e0._12_4_ = (float)(uVar56 ^ auVar43._12_4_);
            fVar41 = *(float *)(ray + k * 4 + 0x60);
            auVar37._0_4_ = local_9d0._0_4_ * fVar41;
            auVar37._4_4_ = local_9d0._4_4_ * fVar41;
            auVar37._8_4_ = local_9d0._8_4_ * fVar41;
            auVar37._12_4_ = local_9d0._12_4_ * fVar41;
            auVar43 = vcmpps_avx(auVar37,local_9e0,1);
            fVar41 = *(float *)(ray + k * 4 + 0x100);
            auVar40._0_4_ = local_9d0._0_4_ * fVar41;
            auVar40._4_4_ = local_9d0._4_4_ * fVar41;
            auVar40._8_4_ = local_9d0._8_4_ * fVar41;
            auVar40._12_4_ = local_9d0._12_4_ * fVar41;
            auVar62 = vcmpps_avx(local_9e0,auVar40,2);
            auVar43 = vandps_avx(auVar43,auVar62);
            auVar62 = auVar7 & auVar43;
            if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar62[0xf] < '\0') {
              local_9b0 = vandps_avx(auVar7,auVar43);
              pSVar2 = context->scene;
              auVar7 = vrcpps_avx(local_9d0);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar43 = vfnmadd213ps_fma(local_9d0,auVar7,auVar34);
              auVar7 = vfmadd132ps_fma(auVar43,auVar7,auVar7);
              fVar41 = auVar7._0_4_;
              fVar44 = auVar7._4_4_;
              fVar45 = auVar7._8_4_;
              fVar46 = auVar7._12_4_;
              local_980[0] = fVar41 * local_9e0._0_4_;
              local_980[1] = fVar44 * local_9e0._4_4_;
              local_980[2] = fVar45 * local_9e0._8_4_;
              local_980[3] = fVar46 * local_9e0._12_4_;
              local_9a0[0] = fVar41 * local_a00._0_4_;
              local_9a0[1] = fVar44 * local_a00._4_4_;
              local_9a0[2] = fVar45 * local_a00._8_4_;
              local_9a0[3] = fVar46 * local_a00._12_4_;
              local_990._0_4_ = fVar41 * local_9f0._0_4_;
              local_990._4_4_ = fVar44 * local_9f0._4_4_;
              local_990._8_4_ = fVar45 * local_9f0._8_4_;
              local_990._12_4_ = fVar46 * local_9f0._12_4_;
              uVar18 = vmovmskps_avx(local_9b0);
              local_b80 = CONCAT44((int)((ulong)pSVar2 >> 0x20),uVar18);
              do {
                local_a30 = auVar68._0_16_;
                uVar6 = 0;
                for (uVar20 = local_b80; (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  uVar6 = uVar6 + 1;
                }
                uVar51 = *(uint *)(lVar22 + uVar28 + 0x90 + uVar6 * 4);
                pGVar3 = (pSVar2->geometries).items[uVar51].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  local_b80 = local_b80 ^ 1L << (uVar6 & 0x3f);
                  bVar30 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar30 = false;
                }
                else {
                  uVar20 = (ulong)(uint)((int)uVar6 * 4);
                  uVar18 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar1 = *(undefined4 *)((long)local_9a0 + uVar20);
                  local_8c0._4_4_ = uVar1;
                  local_8c0._0_4_ = uVar1;
                  local_8c0._8_4_ = uVar1;
                  local_8c0._12_4_ = uVar1;
                  local_8c0._16_4_ = uVar1;
                  local_8c0._20_4_ = uVar1;
                  local_8c0._24_4_ = uVar1;
                  local_8c0._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_990 + uVar20);
                  local_8a0._4_4_ = uVar1;
                  local_8a0._0_4_ = uVar1;
                  local_8a0._8_4_ = uVar1;
                  local_8a0._12_4_ = uVar1;
                  local_8a0._16_4_ = uVar1;
                  local_8a0._20_4_ = uVar1;
                  local_8a0._24_4_ = uVar1;
                  local_8a0._28_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar20);
                  local_a90.context = context->user;
                  local_880 = *(undefined4 *)(lVar22 + uVar28 + 0xa0 + uVar20);
                  local_920 = *(undefined4 *)(local_970 + uVar20);
                  local_900 = *(undefined4 *)(local_960 + uVar20);
                  local_8e0 = *(undefined4 *)(local_950 + uVar20);
                  local_860._4_4_ = uVar51;
                  local_860._0_4_ = uVar51;
                  local_860._8_4_ = uVar51;
                  local_860._12_4_ = uVar51;
                  local_860._16_4_ = uVar51;
                  local_860._20_4_ = uVar51;
                  local_860._24_4_ = uVar51;
                  local_860._28_4_ = uVar51;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_87c = local_880;
                  uStack_878 = local_880;
                  uStack_874 = local_880;
                  uStack_870 = local_880;
                  uStack_86c = local_880;
                  uStack_868 = local_880;
                  uStack_864 = local_880;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_a90.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_a90.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_a60 = local_940._0_8_;
                  uStack_a58 = local_940._8_8_;
                  uStack_a50 = local_940._16_8_;
                  uStack_a48 = local_940._24_8_;
                  local_a90.valid = (int *)&local_a60;
                  local_a90.geometryUserPtr = pGVar3->userPtr;
                  local_a90.hit = (RTCHitN *)&local_920;
                  local_a90.N = 8;
                  local_a90.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_a90);
                  }
                  auVar5._8_8_ = uStack_a58;
                  auVar5._0_8_ = local_a60;
                  auVar5._16_8_ = uStack_a50;
                  auVar5._24_8_ = uStack_a48;
                  auVar5 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
                  auVar32 = _DAT_0205a980 & ~auVar5;
                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar32 >> 0x7f,0) == '\0') &&
                        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar32 >> 0xbf,0) == '\0') &&
                      (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar32[0x1f]) {
                    auVar5 = auVar5 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_a90);
                    }
                    auVar16._8_8_ = uStack_a58;
                    auVar16._0_8_ = local_a60;
                    auVar16._16_8_ = uStack_a50;
                    auVar16._24_8_ = uStack_a48;
                    auVar32 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
                    auVar5 = auVar32 ^ _DAT_0205a980;
                    auVar35._8_4_ = 0xff800000;
                    auVar35._0_8_ = 0xff800000ff800000;
                    auVar35._12_4_ = 0xff800000;
                    auVar35._16_4_ = 0xff800000;
                    auVar35._20_4_ = 0xff800000;
                    auVar35._24_4_ = 0xff800000;
                    auVar35._28_4_ = 0xff800000;
                    auVar32 = vblendvps_avx(auVar35,*(undefined1 (*) [32])(local_a90.ray + 0x100),
                                            auVar32);
                    *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar32;
                  }
                  bVar14 = (auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar15 = (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar13 = (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar12 = SUB321(auVar5 >> 0x7f,0) == '\0';
                  bVar11 = (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar10 = SUB321(auVar5 >> 0xbf,0) == '\0';
                  bVar9 = (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar8 = -1 < auVar5[0x1f];
                  bVar30 = ((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) &&
                           bVar9) && bVar8;
                  if (((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9)
                      && bVar8) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar18;
                    local_b80 = local_b80 ^ 1L << (uVar6 & 0x3f);
                  }
                  auVar68 = ZEXT1664(local_a30);
                }
                if (!bVar30) {
                  uVar51 = 0;
                  if (bVar29) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar51 = 1;
                  }
                  goto LAB_005d1263;
                }
              } while (local_b80 != 0);
            }
          }
          uVar51 = 0;
          uVar27 = uVar27 + 1;
          bVar29 = uVar27 < uVar19;
        } while (uVar27 != uVar19);
      }
    }
LAB_005d1263:
  } while ((uVar51 & 3) == 0);
  return puVar23 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }